

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_rewind(mcpl_file_t ff)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  undefined8 *in_RDI;
  bool bVar5;
  int error;
  int notEOF;
  int already_there;
  mcpl_fileinternal_t *f;
  int64_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = in_RDI[0x11];
  in_RDI[0x11] = 0;
  uVar2 = in_RDI[0x11];
  uVar3 = in_RDI[8];
  if ((uVar2 < uVar3 != 0) && (lVar1 != 0)) {
    if (in_RDI[1] == 0) {
      iVar4 = fseek((FILE *)*in_RDI,in_RDI[0x10],0);
      bVar5 = iVar4 != 0;
    }
    else {
      iVar4 = mcpl_gzseek((gzFile)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
      bVar5 = iVar4 == 0;
    }
    if (bVar5) {
      mcpl_error((char *)0x1064c1);
    }
  }
  return (uint)(uVar2 < uVar3);
}

Assistant:

int mcpl_rewind(mcpl_file_t ff)
{
  MCPLIMP_FILEDECODE;
  int already_there = (f->current_particle_idx==0);
  f->current_particle_idx = 0;
  int notEOF = f->current_particle_idx<f->nparticles;
  if (notEOF&&!already_there) {
    int error;
    if (f->filegz) {
      error = ! mcpl_gzseek( f->filegz, f->first_particle_pos );
    } else {
      error = MCPL_FSEEK( f->file, f->first_particle_pos )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while rewinding particle list");
  }
  return notEOF;
}